

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  FieldDescriptor *pFVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar2;
  OneofDescriptor *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *proto_00;
  Descriptor *this_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_01;
  EnumDescriptor *this_02;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_02;
  ExtensionRange *this_03;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *proto_03;
  int i;
  int iVar3;
  
  CopyHeadingTo(this,proto);
  for (iVar3 = 0; iVar3 < this->field_count_; iVar3 = iVar3 + 1) {
    pFVar1 = field(this,iVar3);
    pVVar2 = internal::RepeatedPtrFieldBase::
             Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase);
    FieldDescriptor::CopyTo(pFVar1,pVVar2);
  }
  for (iVar3 = 0; iVar3 < this->oneof_decl_count_; iVar3 = iVar3 + 1) {
    this_00 = oneof_decl(this,iVar3);
    proto_00 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                         (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase);
    OneofDescriptor::CopyTo(this_00,proto_00);
  }
  for (iVar3 = 0; iVar3 < this->nested_type_count_; iVar3 = iVar3 + 1) {
    this_01 = nested_type(this,iVar3);
    proto_01 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase);
    CopyTo(this_01,proto_01);
  }
  for (iVar3 = 0; iVar3 < this->enum_type_count_; iVar3 = iVar3 + 1) {
    this_02 = enum_type(this,iVar3);
    proto_02 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                         (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase);
    EnumDescriptor::CopyTo(this_02,proto_02);
  }
  for (iVar3 = 0; iVar3 < this->extension_range_count_; iVar3 = iVar3 + 1) {
    this_03 = extension_range(this,iVar3);
    proto_03 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                         (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase);
    ExtensionRange::CopyTo(this_03,proto_03);
  }
  for (iVar3 = 0; iVar3 < this->extension_count_; iVar3 = iVar3 + 1) {
    pFVar1 = extension(this,iVar3);
    pVVar2 = internal::RepeatedPtrFieldBase::
             Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                       (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase);
    FieldDescriptor::CopyTo(pFVar1,pVVar2);
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  CopyHeadingTo(proto);

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    extension_range(i)->CopyTo(proto->add_extension_range());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
}